

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O3

vector<RPCResult,_std::allocator<RPCResult>_> * ScriptPubKeyDoc(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  undefined1 auVar1 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long lVar4;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 uVar5;
  undefined1 in_stack_fffffffffffffaec [28];
  pointer in_stack_fffffffffffffb08;
  pointer in_stack_fffffffffffffb10;
  pointer in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  pointer in_stack_fffffffffffffb28;
  pointer pRVar6;
  pointer in_stack_fffffffffffffb30;
  pointer pRVar7;
  pointer in_stack_fffffffffffffb38;
  pointer pRVar8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_4b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_498;
  vector<RPCResult,_std::allocator<RPCResult>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  size_type *local_420;
  size_type local_418;
  size_type local_410;
  undefined8 uStack_408;
  long *local_400 [2];
  long local_3f0 [2];
  long *local_3e0 [2];
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_340;
  long *local_320 [2];
  long local_310 [2];
  pointer local_300 [2];
  undefined1 local_2f0 [152];
  RPCResult local_258;
  RPCResult local_1d0;
  RPCResult local_148;
  RPCResult local_c0;
  vector<RPCResult,_std::allocator<RPCResult>_> *local_38;
  
  local_38 = *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  local_300[0] = (pointer)local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"asm","");
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"Disassembly of the output script","");
  local_478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._4_28_ = in_stack_fffffffffffffaec;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffae8;
  description._M_string_length = (size_type)in_stack_fffffffffffffb10;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb08;
  description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb18;
  description.field_2._8_8_ = in_stack_fffffffffffffb20;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffffb30;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffffb28;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffffb38;
  RPCResult::RPCResult((RPCResult *)(local_2f0 + 0x10),STR,m_key_name,description,inner,false);
  local_340.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_340.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"desc","");
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,"Inferred descriptor for the output","");
  local_498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._4_28_ = in_stack_fffffffffffffaec;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffae8;
  description_00._M_string_length = (size_type)in_stack_fffffffffffffb10;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb08;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb18;
  description_00.field_2._8_8_ = in_stack_fffffffffffffb20;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffffb30;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffffb28;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffb38;
  RPCResult::RPCResult(&local_258,STR,m_key_name_00,description_00,inner_00,SUB81(&local_340,0));
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"hex","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a0,"The raw output script bytes, hex-encoded","");
  local_4b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._4_28_ = in_stack_fffffffffffffaec;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffae8;
  description_01._M_string_length = (size_type)in_stack_fffffffffffffb10;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb08;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb18;
  description_01.field_2._8_8_ = in_stack_fffffffffffffb20;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffffb30;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffffb28;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffb38;
  RPCResult::RPCResult(&local_1d0,STR_HEX,m_key_name_01,description_01,inner_01,SUB81(local_380,0));
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"address","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,"The Bitcoin address (only if a well-defined address exists)","");
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  uVar5 = 0;
  auVar1._28_4_ = 0;
  auVar1._0_28_ = in_stack_fffffffffffffaec;
  description_02._M_string_length = (size_type)in_stack_fffffffffffffb10;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb08;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb18;
  description_02.field_2._8_8_ = in_stack_fffffffffffffb20;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_148,STR,(string)(auVar1 << 0x20),SUB81(local_3c0,0),description_02,inner_02,true
            );
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"type","");
  GetAllOutputTypes_abi_cxx11_();
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_460,0,0,"The type (one of: ",0x12);
  local_440._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p == paVar3) {
    local_440.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_440.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  }
  else {
    local_440.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_440._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_440,")");
  local_420 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420 == paVar3) {
    local_410 = paVar3->_M_allocated_capacity;
    uStack_408 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_420 = &local_410;
  }
  else {
    local_410 = paVar3->_M_allocated_capacity;
  }
  local_418 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  m_key_name_02._4_28_ = in_stack_fffffffffffffaec;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar5;
  description_03.field_2._M_allocated_capacity = 0;
  description_03._M_dataplus._M_p = (pointer)0x0;
  description_03._M_string_length = 0;
  description_03.field_2._8_8_ = in_stack_fffffffffffffb20;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar7;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar6;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar8;
  RPCResult::RPCResult(&local_c0,STR,m_key_name_02,description_03,inner_03,false);
  __l._M_len = 5;
  __l._M_array = (iterator)(local_2f0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_RDI,__l,(allocator_type *)&stack0xfffffffffffffb07);
  lVar4 = 0x2a8;
  do {
    if ((long *)(local_2f0 + lVar4) != *(long **)((long)local_300 + lVar4)) {
      operator_delete(*(long **)((long)local_300 + lVar4),*(long *)(local_2f0 + lVar4) + 1);
    }
    if ((long *)((long)local_310 + lVar4) != *(long **)((long)local_320 + lVar4)) {
      operator_delete(*(long **)((long)local_320 + lVar4),*(long *)((long)local_310 + lVar4) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_340.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar4));
    if ((long *)((long)local_350 + lVar4) != *(long **)((long)local_360 + lVar4)) {
      operator_delete(*(long **)((long)local_360 + lVar4),*(long *)((long)local_350 + lVar4) + 1);
    }
    lVar4 = lVar4 + -0x88;
  } while (lVar4 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb08);
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if (local_400[0] != local_3f0) {
    operator_delete(local_400[0],local_3f0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb28);
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_4b8);
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_498);
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (local_340.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_340.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_340.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_340.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_478);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  if (local_300[0] != (pointer)local_2f0) {
    operator_delete(local_300[0],local_2f0._0_8_ + 1);
  }
  if (*(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> ScriptPubKeyDoc() {
    return
         {
             {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
             {RPCResult::Type::STR, "desc", "Inferred descriptor for the output"},
             {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
             {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
             {RPCResult::Type::STR, "type", "The type (one of: " + GetAllOutputTypes() + ")"},
         };
}